

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O2

void test_write_format_mtree_no_leading_dotslash(void)

{
  test_write_format_mtree_sub2(0,0);
  test_write_format_mtree_sub2(0,1);
  test_write_format_mtree_sub2(1,0);
  test_write_format_mtree_sub2(1,1);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_mtree_no_leading_dotslash)
{
  /* Default setting */
  test_write_format_mtree_sub2(0, 0);
  /* Directory only */
  test_write_format_mtree_sub2(0, 1);
  /* Use /set keyword */
  test_write_format_mtree_sub2(1, 0);
  /* Use /set keyword with directory only */
  test_write_format_mtree_sub2(1, 1);
}